

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_uncompressed.cpp
# Opt level: O2

CompressionFunction *
duckdb::FixedSizeUncompressed::GetFunction
          (CompressionFunction *__return_storage_ptr__,PhysicalType data_type)

{
  int iVar1;
  InternalException *this;
  undefined7 in_register_00000031;
  allocator local_39;
  string local_38;
  
  iVar1 = (int)CONCAT71(in_register_00000031,data_type);
  switch(iVar1) {
  case 1:
  case 3:
    FixedSizeGetFunction<signed_char,duckdb::StandardFixedSizeAppend>(data_type);
    break;
  case 2:
    FixedSizeGetFunction<unsigned_char,duckdb::StandardFixedSizeAppend>(UINT8);
    break;
  case 4:
    FixedSizeGetFunction<unsigned_short,duckdb::StandardFixedSizeAppend>(UINT16);
    break;
  case 5:
    FixedSizeGetFunction<short,duckdb::StandardFixedSizeAppend>(INT16);
    break;
  case 6:
    FixedSizeGetFunction<unsigned_int,duckdb::StandardFixedSizeAppend>(UINT32);
    break;
  case 7:
    FixedSizeGetFunction<int,duckdb::StandardFixedSizeAppend>(INT32);
    break;
  case 8:
    FixedSizeGetFunction<unsigned_long,duckdb::StandardFixedSizeAppend>(UINT64);
    break;
  case 9:
    FixedSizeGetFunction<long,duckdb::StandardFixedSizeAppend>(INT64);
    break;
  case 10:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x16:
switchD_01a1e139_caseD_a:
    this = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_38,"Unsupported type for FixedSizeUncompressed::GetFunction",
               &local_39);
    InternalException::InternalException(this,&local_38);
    __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case 0xb:
    FixedSizeGetFunction<float,duckdb::StandardFixedSizeAppend>(FLOAT);
    break;
  case 0xc:
    FixedSizeGetFunction<double,duckdb::StandardFixedSizeAppend>(DOUBLE);
    break;
  case 0x15:
    FixedSizeGetFunction<duckdb::interval_t,duckdb::StandardFixedSizeAppend>(INTERVAL);
    break;
  case 0x17:
    FixedSizeGetFunction<unsigned_long,duckdb::ListFixedSizeAppend>(LIST);
    break;
  default:
    if (iVar1 == 0xcb) {
      FixedSizeGetFunction<duckdb::uhugeint_t,duckdb::StandardFixedSizeAppend>(UINT128);
    }
    else {
      if (iVar1 != 0xcc) goto switchD_01a1e139_caseD_a;
      FixedSizeGetFunction<duckdb::hugeint_t,duckdb::StandardFixedSizeAppend>(INT128);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

CompressionFunction FixedSizeUncompressed::GetFunction(PhysicalType data_type) {
	switch (data_type) {
	case PhysicalType::BOOL:
	case PhysicalType::INT8:
		return FixedSizeGetFunction<int8_t>(data_type);
	case PhysicalType::INT16:
		return FixedSizeGetFunction<int16_t>(data_type);
	case PhysicalType::INT32:
		return FixedSizeGetFunction<int32_t>(data_type);
	case PhysicalType::INT64:
		return FixedSizeGetFunction<int64_t>(data_type);
	case PhysicalType::UINT8:
		return FixedSizeGetFunction<uint8_t>(data_type);
	case PhysicalType::UINT16:
		return FixedSizeGetFunction<uint16_t>(data_type);
	case PhysicalType::UINT32:
		return FixedSizeGetFunction<uint32_t>(data_type);
	case PhysicalType::UINT64:
		return FixedSizeGetFunction<uint64_t>(data_type);
	case PhysicalType::INT128:
		return FixedSizeGetFunction<hugeint_t>(data_type);
	case PhysicalType::UINT128:
		return FixedSizeGetFunction<uhugeint_t>(data_type);
	case PhysicalType::FLOAT:
		return FixedSizeGetFunction<float>(data_type);
	case PhysicalType::DOUBLE:
		return FixedSizeGetFunction<double>(data_type);
	case PhysicalType::INTERVAL:
		return FixedSizeGetFunction<interval_t>(data_type);
	case PhysicalType::LIST:
		return FixedSizeGetFunction<uint64_t, ListFixedSizeAppend>(data_type);
	default:
		throw InternalException("Unsupported type for FixedSizeUncompressed::GetFunction");
	}
}